

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O2

int32_t getCurrentYear(void)

{
  uint in_EAX;
  UCalendar *cal;
  UDate dateTime;
  ulong uStack_18;
  UErrorCode status;
  
  uStack_18 = (ulong)in_EAX;
  if (currentYear == -1) {
    cal = ucal_open_63((UChar *)0x0,-1,(char *)0x0,UCAL_DEFAULT,&status);
    dateTime = ucal_getNow_63();
    ucal_setMillis_63(cal,dateTime,&status);
    currentYear = ucal_get_63(cal,UCAL_YEAR,&status);
    ucal_close_63(cal);
  }
  return currentYear;
}

Assistant:

U_CAPI int32_t U_EXPORT2 getCurrentYear() {
#if !UCONFIG_NO_FORMATTING
    UErrorCode status=U_ZERO_ERROR;    
    UCalendar *cal = NULL;

    if(currentYear == -1) {
        cal = ucal_open(NULL, -1, NULL, UCAL_TRADITIONAL, &status);
        ucal_setMillis(cal, ucal_getNow(), &status);
        currentYear = ucal_get(cal, UCAL_YEAR, &status);
        ucal_close(cal);
    }
#else
    /* No formatting- no way to set the current year. */
#endif
    return currentYear;
}